

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixtls.cpp
# Opt level: O0

void pthread_exit(void *__retval)

{
  int iVar1;
  char fname [13];
  char local_15 [13];
  void *local_8;
  
  builtin_strncpy(local_15,"pthread_exit",0xd);
  local_8 = __retval;
  if (pthread_exit::real_pthread_exit == '\0') {
    iVar1 = __cxa_guard_acquire(&pthread_exit::real_pthread_exit);
    if (iVar1 != 0) {
      pthread_exit::real_pthread_exit = (pthread_exit_function)dlsym(0xffffffffffffffff,local_15);
      __cxa_guard_release(&pthread_exit::real_pthread_exit);
    }
  }
  exitRoutine();
  (*pthread_exit::real_pthread_exit)(local_8);
  exit(0);
}

Assistant:

void pthread_exit (void *value_ptr) {
#if defined(__linux__) || defined(__APPLE__)
  char fname[] = "pthread_exit";
#else
  char fname[] = "_pthread_exit";
#endif

  // Instantiate the pointer to pthread_exit, if it hasn't been
  // instantiated yet.

  // A pointer to the library version of pthread_exit.
  static pthread_exit_function real_pthread_exit = 
    reinterpret_cast<pthread_exit_function>
    (reinterpret_cast<intptr_t>(dlsym(RTLD_NEXT, fname)));

  // Do necessary clean-up of the TLAB and get out.
  exitRoutine();
  (*real_pthread_exit)(value_ptr);

  // We should not get here, but doing so disables a warning.
  exit(0);
}